

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_MultipleSubcomMatchingWithCaseInplace2_Test::TestBody
          (TApp_MultipleSubcomMatchingWithCaseInplace2_Test *this)

{
  bool bVar1;
  App *pAVar2;
  AssertHelper local_f0;
  Message local_e8 [2];
  OptionAlreadyAdded *anon_var_0;
  char *pcStack_d0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  App *local_18;
  App *first;
  TApp_MultipleSubcomMatchingWithCaseInplace2_Test *this_local;
  
  first = (App *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"first",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"fIrst",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"",(allocator *)((long)&gtest_msg.value + 7));
  CLI::App::add_subcommand(&(this->super_TApp).app,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff30,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff30);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::App::ignore_case(local_18,true);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      return;
    }
    pcStack_d0 = 
    "Expected: first->ignore_case() throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_e8);
  testing::internal::AssertHelper::AssertHelper
            (&local_f0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x67,pcStack_d0);
  testing::internal::AssertHelper::operator=(&local_f0,local_e8);
  testing::internal::AssertHelper::~AssertHelper(&local_f0);
  testing::Message::~Message(local_e8);
  return;
}

Assistant:

TEST_F(TApp, MultipleSubcomMatchingWithCaseInplace2) {
    auto first = app.add_subcommand("first");
    app.add_subcommand("fIrst");

    EXPECT_THROW(first->ignore_case(), CLI::OptionAlreadyAdded);
}